

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

void __thiscall
peg::Sequence::
Sequence<std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>>
          (Sequence *this,shared_ptr<peg::Ope> *args,shared_ptr<peg::Ope> *args_1,
          shared_ptr<peg::Ope> *args_2,shared_ptr<peg::Ope> *args_3,shared_ptr<peg::Ope> *args_4)

{
  initializer_list<std::shared_ptr<peg::Ope>_> __l;
  shared_ptr<peg::Ope> *local_d8;
  allocator<std::shared_ptr<peg::Ope>_> local_99;
  shared_ptr<peg::Ope> local_98;
  shared_ptr<peg::Ope> local_88;
  shared_ptr<peg::Ope> local_78;
  shared_ptr<peg::Ope> local_68;
  shared_ptr<peg::Ope> local_58;
  shared_ptr<peg::Ope> local_48;
  shared_ptr<peg::Ope> *local_38;
  shared_ptr<peg::Ope> *args_local_4;
  shared_ptr<peg::Ope> *args_local_3;
  shared_ptr<peg::Ope> *args_local_2;
  shared_ptr<peg::Ope> *args_local_1;
  shared_ptr<peg::Ope> *args_local;
  Sequence *this_local;
  
  local_38 = args_4;
  args_local_4 = args_3;
  args_local_3 = args_2;
  args_local_2 = args_1;
  args_local_1 = args;
  args_local = (shared_ptr<peg::Ope> *)this;
  Ope::Ope(&this->super_Ope);
  (this->super_Ope)._vptr_Ope = (_func_int **)&PTR__Sequence_00210af8;
  std::shared_ptr<peg::Ope>::shared_ptr(&local_98,args_local_1);
  std::shared_ptr<peg::Ope>::shared_ptr(&local_88,args_local_2);
  std::shared_ptr<peg::Ope>::shared_ptr(&local_78,args_local_3);
  std::shared_ptr<peg::Ope>::shared_ptr(&local_68,args_local_4);
  std::shared_ptr<peg::Ope>::shared_ptr(&local_58,local_38);
  local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
  local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_98;
  std::allocator<std::shared_ptr<peg::Ope>_>::allocator(&local_99);
  __l._M_len = (size_type)
               local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  __l._M_array = (iterator)local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_>::vector
            (&this->opes_,__l,&local_99);
  std::allocator<std::shared_ptr<peg::Ope>_>::~allocator(&local_99);
  local_d8 = &local_48;
  do {
    local_d8 = local_d8 + -1;
    std::shared_ptr<peg::Ope>::~shared_ptr(local_d8);
  } while (local_d8 != &local_98);
  return;
}

Assistant:

Sequence(const Args &...args)
      : opes_{static_cast<std::shared_ptr<Ope>>(args)...} {}